

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_common_isonumber.c
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  char **argv_local;
  int argc_local;
  
  BEGIN_TESTING(clear_elements);
  test_str_from_isonumber_u64();
  test_isonumber_to_u64_to_string();
  test_str_from_isonumber_s64();
  test_isonumber_to_s64_to_string();
  test_str_from_isonumber_s64_2();
  iVar1 = FINISH_TESTING();
  return iVar1;
}

Assistant:

int
main(int argc __attribute__ ((unused)), char **argv __attribute__ ((unused))) {
  BEGIN_TESTING(clear_elements);

  test_str_from_isonumber_u64();
  test_isonumber_to_u64_to_string();

  test_str_from_isonumber_s64();
  test_isonumber_to_s64_to_string();
  test_str_from_isonumber_s64_2();

  return FINISH_TESTING();
}